

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyComputeWorstCase
              (Vec_Ptr_t *vTables,Vec_Flt_t **pvInd0,Vec_Flt_t **pvInd1,Vec_Flt_t **pvValues)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void **ppvVar7;
  int *piVar8;
  long lVar9;
  Vec_Flt_t *pVVar10;
  float *__dest;
  Vec_Flt_t *pVVar11;
  float *__dest_00;
  Vec_Flt_t *pVVar12;
  float *__dest_01;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  uVar2 = vTables->nSize;
  if (((int)uVar2 < 1) || (uVar17 = (ulong)uVar2, uVar2 % 3 != 0)) {
    __assert_fail("Vec_PtrSize(vTables) > 0 && Vec_PtrSize(vTables) % 3 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x495,
                  "int Scl_LibertyComputeWorstCase(Vec_Ptr_t *, Vec_Flt_t **, Vec_Flt_t **, Vec_Flt_t **)"
                 );
  }
  ppvVar7 = vTables->pArray;
  pVVar11 = (Vec_Flt_t *)*ppvVar7;
  if (uVar2 - 3 < 3) {
    *pvInd0 = pVVar11;
    *pvInd1 = (Vec_Flt_t *)vTables->pArray[1];
    *pvValues = (Vec_Flt_t *)vTables->pArray[2];
    vTables->nSize = 0;
    return 1;
  }
  pVVar10 = (Vec_Flt_t *)malloc(0x10);
  uVar3 = pVVar11->nSize;
  pVVar10->nSize = uVar3;
  iVar4 = pVVar11->nCap;
  pVVar10->nCap = iVar4;
  if ((long)iVar4 == 0) {
    __dest = (float *)0x0;
  }
  else {
    __dest = (float *)malloc((long)iVar4 << 2);
  }
  pVVar10->pArray = __dest;
  memcpy(__dest,pVVar11->pArray,(long)(int)uVar3 * 4);
  if (1 < uVar2) {
    piVar8 = (int *)ppvVar7[1];
    pVVar11 = (Vec_Flt_t *)malloc(0x10);
    uVar5 = piVar8[1];
    pVVar11->nSize = uVar5;
    iVar4 = *piVar8;
    pVVar11->nCap = iVar4;
    if ((long)iVar4 == 0) {
      __dest_00 = (float *)0x0;
    }
    else {
      __dest_00 = (float *)malloc((long)iVar4 << 2);
    }
    pVVar11->pArray = __dest_00;
    memcpy(__dest_00,*(void **)(piVar8 + 2),(long)(int)uVar5 * 4);
    if (uVar2 != 2) {
      piVar8 = (int *)ppvVar7[2];
      pVVar12 = (Vec_Flt_t *)malloc(0x10);
      uVar6 = piVar8[1];
      pVVar12->nSize = uVar6;
      iVar4 = *piVar8;
      pVVar12->nCap = iVar4;
      if ((long)iVar4 == 0) {
        __dest_01 = (float *)0x0;
      }
      else {
        __dest_01 = (float *)malloc((long)iVar4 << 2);
      }
      pVVar12->pArray = __dest_01;
      memcpy(__dest_01,*(void **)(piVar8 + 2),(long)(int)uVar6 * 4);
      if (5 < uVar2) {
        if ((int)uVar6 < 1) {
          uVar6 = 0;
        }
        uVar13 = 2;
        if (2 < (int)uVar2 / 3) {
          uVar13 = (ulong)(uint)((int)uVar2 / 3);
        }
        uVar14 = 1;
        do {
          uVar16 = uVar14 * 3;
          if (((uVar17 <= uVar16) || (uVar17 <= uVar16 + 1)) || (uVar17 <= uVar16 + 2))
          goto LAB_00462dbe;
          if (*(uint *)((long)ppvVar7[uVar14 * 3] + 4) == uVar3) {
            if (0 < (int)uVar3) {
              uVar16 = 0;
              do {
                fVar1 = *(float *)(*(long *)((long)ppvVar7[uVar14 * 3] + 8) + uVar16 * 4);
                if ((fVar1 != __dest[uVar16]) || (NAN(fVar1) || NAN(__dest[uVar16])))
                goto LAB_00462d77;
                uVar16 = uVar16 + 1;
              } while (uVar3 != uVar16);
            }
            if (*(uint *)((long)ppvVar7[uVar14 * 3 + 1] + 4) == uVar5) {
              if (0 < (int)uVar5) {
                uVar16 = 0;
                do {
                  fVar1 = *(float *)(*(long *)((long)ppvVar7[uVar14 * 3 + 1] + 8) + uVar16 * 4);
                  if ((fVar1 != __dest_00[uVar16]) || (NAN(fVar1) || NAN(__dest_00[uVar16])))
                  goto LAB_00462d77;
                  uVar16 = uVar16 + 1;
                } while (uVar5 != uVar16);
              }
              uVar16 = (ulong)*(int *)((long)ppvVar7[uVar14 * 3 + 2] + 4);
              if (0 < (long)uVar16) {
                lVar9 = *(long *)((long)ppvVar7[uVar14 * 3 + 2] + 8);
                uVar15 = 0;
                do {
                  if (uVar6 == uVar15) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
                  }
                  fVar1 = *(float *)(lVar9 + uVar15 * 4);
                  if (__dest_01[uVar15] <= fVar1 && fVar1 != __dest_01[uVar15]) {
                    __dest_01[uVar15] = fVar1;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar16 != uVar15);
              }
            }
          }
LAB_00462d77:
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar13);
      }
      *pvInd0 = pVVar10;
      *pvInd1 = pVVar11;
      *pvValues = pVVar12;
      return 1;
    }
  }
LAB_00462dbe:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Scl_LibertyComputeWorstCase( Vec_Ptr_t * vTables, Vec_Flt_t ** pvInd0, Vec_Flt_t ** pvInd1, Vec_Flt_t ** pvValues )
{
    Vec_Flt_t * vInd0, * vInd1, * vValues;
    Vec_Flt_t * vind0, * vind1, * vvalues;
    int i, k, nTriples = Vec_PtrSize(vTables) / 3;
    float Entry;
    assert( Vec_PtrSize(vTables) > 0 && Vec_PtrSize(vTables) % 3 == 0 );
    if ( nTriples == 1 )
    {
        *pvInd0   = (Vec_Flt_t *)Vec_PtrEntry(vTables, 0);
        *pvInd1   = (Vec_Flt_t *)Vec_PtrEntry(vTables, 1);
        *pvValues = (Vec_Flt_t *)Vec_PtrEntry(vTables, 2);
        Vec_PtrShrink( vTables, 0 );
        return 1;
    }
    vInd0   = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 0) );
    vInd1   = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 1) );
    vValues = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 2) );
    for ( i = 1; i < nTriples; i++ )
    {
        vind0   = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+0);
        vind1   = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+1);
        vvalues = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+2);
        // check equality of indexes
        if ( !Vec_FltEqual(vind0, vInd0) )
            continue;//return 0;
        if ( !Vec_FltEqual(vind1, vInd1) )
            continue;//return 0;
//        Vec_FltForEachEntry( vvalues, Entry, k )
//            Vec_FltAddToEntry( vValues, k, Entry );
        Vec_FltForEachEntry( vvalues, Entry, k )
            if ( Vec_FltEntry(vValues, k) < Entry )
                Vec_FltWriteEntry( vValues, k, Entry );
    }
//    Vec_FltForEachEntry( vValues, Entry, k )
//        Vec_FltWriteEntry( vValues, k, Entry/nTriples );
    // return the result
    *pvInd0 = vInd0;
    *pvInd1 = vInd1;
    *pvValues = vValues;
    return 1;
}